

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::picker_log_alert::picker_log_alert
          (picker_log_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,
          peer_id *peer_id,picker_flags_t flags,span<const_libtorrent::piece_block> blocks)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  allocation_slot aVar4;
  span<const_char> buf;
  
  torrent_alert::torrent_alert((torrent_alert *)this,alloc,h);
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_alert_004557a0;
  uVar1 = *(undefined8 *)&(ep->impl_).data_;
  uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
  *(undefined8 *)
   ((long)&(this->super_peer_alert).endpoint.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_
   + 0xc) = *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
  *(undefined8 *)
   ((long)&(this->super_peer_alert).endpoint.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_
   + 0x14) = uVar3;
  *(undefined8 *)
   &(this->super_peer_alert).endpoint.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ = uVar1
  ;
  *(undefined8 *)
   ((long)&(this->super_peer_alert).endpoint.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_
   + 8) = uVar2;
  uVar1 = *(undefined8 *)((peer_id->m_number)._M_elems + 2);
  *(undefined8 *)(this->super_peer_alert).pid.m_number._M_elems =
       *(undefined8 *)(peer_id->m_number)._M_elems;
  *(undefined8 *)((this->super_peer_alert).pid.m_number._M_elems + 2) = uVar1;
  (this->super_peer_alert).pid.m_number._M_elems[4] = (peer_id->m_number)._M_elems[4];
  uVar1 = *(undefined8 *)&(ep->impl_).data_;
  uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
  *(undefined8 *)
   ((long)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 0xc)
       = *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
  *(undefined8 *)
   ((long)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 0x14
   ) = uVar3;
  *(undefined8 *)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_
       = uVar1;
  *(undefined8 *)
   ((long)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 8) =
       uVar2;
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_alert_00457148;
  *(uint *)&(this->super_peer_alert).field_0x9c = flags.m_val;
  buf.m_len = blocks.m_len * 8;
  buf.m_ptr = (char *)blocks.m_ptr;
  aVar4 = aux::stack_allocator::copy_buffer(alloc,buf);
  (this->m_array_idx).m_idx = aVar4.m_idx;
  this->m_num_blocks = (int)blocks.m_len;
  return;
}

Assistant:

picker_log_alert::picker_log_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, tcp::endpoint const& ep, peer_id const& peer_id, picker_flags_t const flags
		, span<piece_block const> blocks)
		: peer_alert(alloc, h, ep, peer_id)
		, picker_flags(flags)
		, m_array_idx(alloc.copy_buffer({reinterpret_cast<char const*>(blocks.data())
			, blocks.size() * int(sizeof(piece_block))}))
		, m_num_blocks(int(blocks.size()))
	{}